

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

double __thiscall re2::trunc_abi_cxx11_(re2 *this,double __x)

{
  int iVar1;
  StringPiece *in_RSI;
  double dVar2;
  StringPiece local_38 [2];
  StringPiece *local_18;
  StringPiece *pattern_local;
  
  local_18 = in_RSI;
  pattern_local = (StringPiece *)this;
  iVar1 = StringPiece::size(in_RSI);
  if (iVar1 < 100) {
    dVar2 = (double)StringPiece::as_string_abi_cxx11_((StringPiece *)this);
  }
  else {
    StringPiece::substr(local_18,0,100);
    StringPiece::as_string_abi_cxx11_(local_38);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)local_38);
    dVar2 = (double)std::__cxx11::string::~string((string *)local_38);
  }
  return dVar2;
}

Assistant:

static string trunc(const StringPiece& pattern) {
  if (pattern.size() < 100)
    return pattern.as_string();
  return pattern.substr(0, 100).as_string() + "...";
}